

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::Configure(cmMakefile *this)

{
  bool bVar1;
  char *pcVar2;
  reference ppcVar3;
  __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
  local_b8;
  __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
  local_b0;
  iterator sdi;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> subdirs;
  string local_88 [8];
  string currentStart;
  string local_58 [8];
  string filesDir;
  cmMakefileCurrent cmf;
  cmMakefile *this_local;
  
  cmMakefileCurrent::cmMakefileCurrent((cmMakefileCurrent *)((long)&filesDir.field_2 + 8),this);
  pcVar2 = cmState::Snapshot::GetCurrentBinaryDirectory(&this->StateSnapshot);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_58,pcVar2,(allocator *)(currentStart.field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator((allocator<char> *)(currentStart.field_2._M_local_buf + 0xb));
  pcVar2 = cmake::GetCMakeFilesDirectory();
  std::__cxx11::string::operator+=(local_58,pcVar2);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cmsys::SystemTools::MakeDirectory(pcVar2);
  pcVar2 = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_88,pcVar2,
             (allocator *)
             ((long)&subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::operator+=(local_88,"/CMakeLists.txt");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar2,true);
  if (!bVar1) {
    __assert_fail("cmSystemTools::FileExists(currentStart.c_str(), true)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmMakefile.cxx"
                  ,0x685,"void cmMakefile::Configure()");
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  ProcessBuildsystemFile(this,pcVar2);
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
            ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi,
             &this->UnConfiguredDirectories);
  local_b0._M_current =
       (cmMakefile **)
       std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::begin
                 ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi);
  while( true ) {
    local_b8._M_current =
         (cmMakefile **)
         std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::end
                   ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi);
    bVar1 = __gnu_cxx::operator!=(&local_b0,&local_b8);
    if (!bVar1) break;
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
              ::operator*(&local_b0);
    ConfigureSubDirectory(this,*ppcVar3);
    __gnu_cxx::
    __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>::
    operator++(&local_b0);
  }
  AddCMakeDependFilesFromUser(this);
  SetConfigured(this);
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~vector
            ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_58);
  cmMakefileCurrent::~cmMakefileCurrent((cmMakefileCurrent *)((long)&filesDir.field_2 + 8));
  return;
}

Assistant:

void cmMakefile::Configure()
{
  cmMakefileCurrent cmf(this);

  // make sure the CMakeFiles dir is there
  std::string filesDir = this->StateSnapshot.GetCurrentBinaryDirectory();
  filesDir += cmake::GetCMakeFilesDirectory();
  cmSystemTools::MakeDirectory(filesDir.c_str());

  std::string currentStart = this->StateSnapshot.GetCurrentSourceDirectory();
  currentStart += "/CMakeLists.txt";
  assert(cmSystemTools::FileExists(currentStart.c_str(), true));
  this->ProcessBuildsystemFile(currentStart.c_str());

   // at the end handle any old style subdirs
  std::vector<cmMakefile*> subdirs = this->UnConfiguredDirectories;

  // for each subdir recurse
  std::vector<cmMakefile*>::iterator sdi = subdirs.begin();
  for (; sdi != subdirs.end(); ++sdi)
    {
    this->ConfigureSubDirectory(*sdi);
    }

  this->AddCMakeDependFilesFromUser();
  this->SetConfigured();
}